

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QList<QPersistentModelIndexData_*>_>::end(QList<QList<QPersistentModelIndexData_*>_> *this)

{
  QList<QPersistentModelIndexData_*> *n;
  QArrayDataPointer<QList<QPersistentModelIndexData_*>_> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QList<QPersistentModelIndexData_*>_> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QList<QPersistentModelIndexData_*>_> *)0x81d079);
  QArrayDataPointer<QList<QPersistentModelIndexData_*>_>::operator->(in_RDI);
  n = QArrayDataPointer<QList<QPersistentModelIndexData_*>_>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }